

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader14.cpp
# Opt level: O2

void __thiscall COLLADASaxFWL::NodeLoader14::begin__instance_light(NodeLoader14 *this)

{
  instance_light__AttributeData *in_RSI;
  
  begin__instance_light
            ((NodeLoader14 *)&this[-1].super_IParserImpl14.super_ColladaParserAutoGen14,in_RSI);
  return;
}

Assistant:

bool NodeLoader14::begin__instance_light( const COLLADASaxFWL14::instance_light__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__instance_light(attributeData));
COLLADASaxFWL::instance_light__AttributeData attrData;
attrData.present_attributes = 0;
attrData.sid = attributeData.sid;
attrData.name = attributeData.name;
if ( (attributeData.present_attributes & COLLADASaxFWL14::instance_light__AttributeData::ATTRIBUTE_URL_PRESENT) == COLLADASaxFWL14::instance_light__AttributeData::ATTRIBUTE_URL_PRESENT ) {
    attrData.url = attributeData.url;
    attrData.present_attributes |= COLLADASaxFWL::instance_light__AttributeData::ATTRIBUTE_URL_PRESENT;
}
return mLoader->begin__instance_light(attrData);
}